

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.h
# Opt level: O3

bool __thiscall QBitArray::fill(QBitArray *this,bool aval,qsizetype asize)

{
  QArrayData *pQVar1;
  qsizetype qVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QBitArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (asize < 0) {
    pcVar3 = (this->d).d.ptr;
    if (pcVar3 == (char *)0x0) {
      pcVar3 = (char *)&QByteArray::_empty;
    }
    asize = (this->d).d.size * 8 - (long)*pcVar3;
  }
  QBitArray::QBitArray(&local_38,asize,aval);
  pQVar1 = &((this->d).d.d)->super_QArrayData;
  pcVar3 = (this->d).d.ptr;
  *(undefined4 *)&(this->d).d.d = local_38.d.d.d._0_4_;
  *(undefined4 *)((long)&(this->d).d.d + 4) = local_38.d.d.d._4_4_;
  *(undefined4 *)&(this->d).d.ptr = local_38.d.d.ptr._0_4_;
  *(undefined4 *)((long)&(this->d).d.ptr + 4) = local_38.d.d.ptr._4_4_;
  qVar2 = (this->d).d.size;
  (this->d).d.size = local_38.d.d.size;
  local_38.d.d.d = (Data *)pQVar1;
  local_38.d.d.ptr = pcVar3;
  local_38.d.d.size = qVar2;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool fill(bool aval, qsizetype asize = -1)
    { *this = QBitArray((asize < 0 ? this->size() : asize), aval); return true; }